

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O3

void __thiscall
Js::InterpreterStackFrame::
OP_ProfiledArgOut_A<Js::OpLayoutDynamicProfile<Js::OpLayoutT_Arg<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutDynamicProfile<Js::OpLayoutT_Arg<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>_>
          *playout)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  
  FunctionBody::GetDynamicProfileInfo(*(FunctionBody **)(this + 0x88));
  uVar3 = (playout->super_OpLayoutT_Arg<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>).Reg;
  if (uVar3 < 2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x2185,"(playout->Reg > FunctionBody::FirstRegSlot)",
                                "playout->Reg > FunctionBody::FirstRegSlot");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    uVar3 = (playout->super_OpLayoutT_Arg<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>).Reg;
  }
  ValidateRegValue(this,*(Var *)(this + (ulong)uVar3 * 8 + 0x160),false,true);
}

Assistant:

void InterpreterStackFrame::OP_ProfiledArgOut_A(const unaligned T * playout)
    {
        FunctionBody* functionBody = this->m_functionBody;
        DynamicProfileInfo * dynamicProfileInfo = functionBody->GetDynamicProfileInfo();

        Assert(playout->Reg > FunctionBody::FirstRegSlot);
        Var value = GetReg(playout->Reg);
        dynamicProfileInfo->RecordParameterAtCallSite(functionBody, playout->profileId, value, playout->Arg, playout->Reg);
        SetOut(playout->Arg, value);
    }